

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O1

void __thiscall
cppnet::BufferQueue::BufferQueue
          (BufferQueue *this,shared_ptr<cppnet::BlockMemoryPool> *block_pool,
          shared_ptr<cppnet::AlloterWrap> *alloter)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_InnerBuffer).super_Buffer._vptr_Buffer = (_func_int **)&PTR__BufferQueue_001267f8;
  this->_can_read_length = 0;
  (this->_buffer_list)._size = 0;
  (this->_buffer_list)._head.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->_buffer_list)._head.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_buffer_list)._tail.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->_buffer_list)._tail.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_block_alloter).super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (block_pool->super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var1 = (block_pool->super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->_block_alloter).super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->_alloter).super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (alloter->super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (alloter->super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->_alloter).super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      return;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  return;
}

Assistant:

BufferQueue::BufferQueue(const std::shared_ptr<BlockMemoryPool>& block_pool, 
    const std::shared_ptr<AlloterWrap>& alloter):
    _can_read_length(0),
    _block_alloter(block_pool),
    _alloter(alloter) {

}